

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::int_writer<long_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  char **it_local;
  dec_writer *this_local;
  
  pcVar1 = internal::format_decimal<char*,unsigned_long>
                     (*it,*(unsigned_long *)this,*(uint *)(this + 8));
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal(it, abs_value, num_digits);
      }